

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<slang::ast::BlockEventListControl::Event>::
emplaceRealloc<slang::ast::BlockEventListControl::Event>
          (SmallVectorBase<slang::ast::BlockEventListControl::Event> *this,pointer pos,Event *args)

{
  ulong uVar1;
  size_type sVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  bool bVar5;
  undefined7 uVar6;
  pointer pEVar7;
  pointer pEVar8;
  Event *__cur;
  pointer pEVar9;
  EVP_PKEY_CTX *ctx;
  long lVar10;
  ulong capacity;
  
  if (this->len == 0x7fffffffffffffff) {
    detail::throwLengthError();
  }
  capacity = this->len + 1;
  uVar1 = this->cap;
  if (capacity < uVar1 * 2) {
    capacity = uVar1 * 2;
  }
  if (0x7fffffffffffffff - uVar1 < uVar1) {
    capacity = 0x7fffffffffffffff;
  }
  lVar10 = (long)pos - (long)this->data_;
  ctx = (EVP_PKEY_CTX *)0x10;
  pEVar7 = (pointer)detail::allocArray(capacity,0x10);
  uVar4 = *(undefined8 *)&args->isBegin;
  *(undefined8 *)((long)pEVar7 + lVar10) = args->target;
  ((undefined8 *)((long)pEVar7 + lVar10))[1] = uVar4;
  pEVar8 = this->data_;
  pEVar9 = pEVar7;
  if (pEVar8 + this->len == pos) {
    for (; pEVar8 != pos; pEVar8 = pEVar8 + 1) {
      bVar5 = pEVar8->isBegin;
      uVar6 = *(undefined7 *)&pEVar8->field_0x9;
      pEVar9->target = pEVar8->target;
      pEVar9->isBegin = bVar5;
      *(undefined7 *)&pEVar9->field_0x9 = uVar6;
      pEVar9 = pEVar9 + 1;
    }
  }
  else {
    for (; pEVar8 != pos; pEVar8 = pEVar8 + 1) {
      bVar5 = pEVar8->isBegin;
      uVar6 = *(undefined7 *)&pEVar8->field_0x9;
      pEVar9->target = pEVar8->target;
      pEVar9->isBegin = bVar5;
      *(undefined7 *)&pEVar9->field_0x9 = uVar6;
      pEVar9 = pEVar9 + 1;
    }
    sVar2 = this->len;
    pEVar8 = this->data_;
    puVar3 = (undefined8 *)((long)pEVar7 + lVar10);
    for (; pos != pEVar8 + sVar2; pos = pos + 1) {
      uVar4 = *(undefined8 *)&pos->isBegin;
      puVar3[2] = pos->target;
      puVar3[3] = uVar4;
      puVar3 = puVar3 + 2;
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = capacity;
  this->data_ = pEVar7;
  return (pointer)((long)pEVar7 + lVar10);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}